

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O2

void __thiscall GEO::ProgressTask::update(ProgressTask *this)

{
  uint uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ProgressClient *pPVar5;
  undefined8 *puVar6;
  undefined8 in_RSI;
  
  uVar1 = this->step_;
  uVar3 = uVar1 * 100;
  uVar4 = uVar3 / this->max_steps_;
  uVar2 = 100;
  if (uVar4 < 100) {
    uVar2 = uVar4;
  }
  if ((uVar2 != this->percent_) && (this->percent_ = uVar2, this->quiet_ == false)) {
    if (::(anonymous_namespace)::task_canceled_ == '\x01') {
      puVar6 = (undefined8 *)
               __cxa_allocate_exception(8,in_RSI,(ulong)uVar3 % (ulong)this->max_steps_);
      *puVar6 = &PTR__exception_001ae168;
      __cxa_throw(puVar6,&TaskCanceled::typeinfo,std::exception::~exception);
    }
    if (::(anonymous_namespace)::progress_client_ != 0) {
      pPVar5 = SmartPointer<GEO::ProgressClient>::operator->
                         ((SmartPointer<GEO::ProgressClient> *)
                          &::(anonymous_namespace)::progress_client_);
      UNRECOVERED_JUMPTABLE = (pPVar5->super_Counted)._vptr_Counted[3];
      (*UNRECOVERED_JUMPTABLE)(pPVar5,(ulong)uVar1,(ulong)uVar2,UNRECOVERED_JUMPTABLE);
      return;
    }
  }
  return;
}

Assistant:

void ProgressTask::update() {
	index_t new_percent =
	    std::min(index_t(100), index_t(step_ * 100 / max_steps_));
	if(new_percent != percent_) {
	    percent_ = new_percent;
	    if(!quiet_) {
		task_progress(step_, percent_);
	    }
	}
    }